

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerHeader.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::LayerHeader::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,LayerHeader *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"LayerHeader:");
  poVar1 = std::operator<<(poVar1,"\n\tLayer Number:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8LayerNumber);
  poVar1 = std::operator<<(poVar1,"\n\tLayer Specific Info: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8LayerSpecificInfo);
  poVar1 = std::operator<<(poVar1,"\n\tLayer Length:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16LayerLength);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

KString LayerHeader::GetAsString() const
{
    KStringStream ss;

    ss << "LayerHeader:"
       << "\n\tLayer Number:        " << ( KUINT16 )m_ui8LayerNumber
       << "\n\tLayer Specific Info: " << ( KUINT16 )m_ui8LayerSpecificInfo
       << "\n\tLayer Length:        " << m_ui16LayerLength
       << "\n";

    return ss.str();
}